

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

int32_t __thiscall
icu_63::anon_unknown_0::MutableCodePointTrie::compactData
          (MutableCodePointTrie *this,int32_t fastILimit,uint32_t *newData,int32_t dataNullIndex)

{
  int iVar1;
  uint32_t dataOffset;
  uint32_t uVar2;
  uint32_t *q;
  bool local_69;
  int local_5c;
  uint32_t j;
  int32_t n_1;
  uint32_t *block;
  int local_48;
  int32_t start;
  int32_t n;
  uint32_t value;
  int32_t i_1;
  int32_t fastLength;
  int32_t inc;
  int32_t blockLength;
  int32_t iLimit;
  int32_t i;
  int32_t newDataLength;
  int32_t dataNullIndex_local;
  uint32_t *newData_local;
  int32_t fastILimit_local;
  MutableCodePointTrie *this_local;
  
  blockLength = 0;
  for (iLimit = 0; iLimit < 0x80; iLimit = iLimit + 0x40) {
    this->index[blockLength] = iLimit;
    blockLength = blockLength + 4;
  }
  iVar1 = this->highStart;
  fastLength = 0x40;
  i_1 = 4;
  value = 0;
  for (n = 8; n < iVar1 >> 4; n = i_1 + n) {
    if (n == fastILimit) {
      fastLength = 0x10;
      i_1 = 1;
      value = iLimit;
    }
    if (this->flags[n] == '\0') {
      uVar2 = this->index[n];
      block._4_4_ = 0;
      while( true ) {
        dataOffset = findAllSameBlock(newData,block._4_4_,iLimit,uVar2,fastLength);
        local_69 = false;
        if ((((-1 < (int)dataOffset) && (local_69 = false, n == dataNullIndex)) &&
            (local_69 = false, fastILimit <= n)) && (local_69 = false, (int)dataOffset < (int)value)
           ) {
          local_69 = isStartOfSomeFastBlock(dataOffset,this->index,fastILimit);
        }
        if (local_69 == false) break;
        block._4_4_ = dataOffset + 1;
      }
      if ((int)dataOffset < 0) {
        local_48 = getAllSameOverlap(newData,iLimit,uVar2,fastLength);
        this->index[n] = iLimit - local_48;
        for (; local_48 < fastLength; local_48 = local_48 + 1) {
          newData[iLimit] = uVar2;
          iLimit = iLimit + 1;
        }
      }
      else {
        this->index[n] = dataOffset;
      }
    }
    else if (this->flags[n] == '\x01') {
      q = this->data + this->index[n];
      uVar2 = findSameBlock(newData,0,iLimit,q,0,fastLength);
      if ((int)uVar2 < 0) {
        local_5c = getOverlap(newData,iLimit,q,0,fastLength);
        this->index[n] = iLimit - local_5c;
        while (local_5c < fastLength) {
          newData[iLimit] = q[local_5c];
          local_5c = local_5c + 1;
          iLimit = iLimit + 1;
        }
      }
      else {
        this->index[n] = uVar2;
      }
    }
    else {
      this->index[n] = this->index[this->index[n]];
    }
  }
  return iLimit;
}

Assistant:

int32_t MutableCodePointTrie::compactData(int32_t fastILimit,
                                          uint32_t *newData, int32_t dataNullIndex) {
#ifdef UCPTRIE_DEBUG
    int32_t countSame=0, sumOverlaps=0;
    bool printData = dataLength == 29088 /* line.brk */ ||
        // dataLength == 30048 /* CanonIterData */ ||
        dataLength == 50400 /* zh.txt~stroke */;
#endif

    // The linear ASCII data has been copied into newData already.
    int32_t newDataLength = 0;
    for (int32_t i = 0; newDataLength < ASCII_LIMIT;
            newDataLength += UCPTRIE_FAST_DATA_BLOCK_LENGTH, i += SMALL_DATA_BLOCKS_PER_BMP_BLOCK) {
        index[i] = newDataLength;
#ifdef UCPTRIE_DEBUG
        if (printData) {
            printBlock(newData + newDataLength, UCPTRIE_FAST_DATA_BLOCK_LENGTH, 0, newDataLength, 0, initialValue);
        }
#endif
    }

    int32_t iLimit = highStart >> UCPTRIE_SHIFT_3;
    int32_t blockLength = UCPTRIE_FAST_DATA_BLOCK_LENGTH;
    int32_t inc = SMALL_DATA_BLOCKS_PER_BMP_BLOCK;
    int32_t fastLength = 0;
    for (int32_t i = ASCII_I_LIMIT; i < iLimit; i += inc) {
        if (i == fastILimit) {
            blockLength = UCPTRIE_SMALL_DATA_BLOCK_LENGTH;
            inc = 1;
            fastLength = newDataLength;
        }
        if (flags[i] == ALL_SAME) {
            uint32_t value = index[i];
            int32_t n;
            // Find an earlier part of the data array of length blockLength
            // that is filled with this value.
            // If we find a match, and the current block is the data null block,
            // and it is not a fast block but matches the start of a fast block,
            // then we need to continue looking.
            // This is because this small block is shorter than the fast block,
            // and not all of the rest of the fast block is filled with this value.
            // Otherwise trie.getRange() would detect that the fast block starts at
            // dataNullOffset and assume incorrectly that it is filled with the null value.
            for (int32_t start = 0;
                    (n = findAllSameBlock(newData, start, newDataLength,
                                value, blockLength)) >= 0 &&
                            i == dataNullIndex && i >= fastILimit && n < fastLength &&
                            isStartOfSomeFastBlock(n, index, fastILimit);
                    start = n + 1) {}
            if (n >= 0) {
                DEBUG_DO(++countSame);
                index[i] = n;
            } else {
                n = getAllSameOverlap(newData, newDataLength, value, blockLength);
                DEBUG_DO(sumOverlaps += n);
#ifdef UCPTRIE_DEBUG
                if (printData) {
                    printBlock(nullptr, blockLength, value, i << UCPTRIE_SHIFT_3, n, initialValue);
                }
#endif
                index[i] = newDataLength - n;
                while (n < blockLength) {
                    newData[newDataLength++] = value;
                    ++n;
                }
            }
        } else if (flags[i] == MIXED) {
            const uint32_t *block = data + index[i];
            int32_t n = findSameBlock(newData, 0, newDataLength, block, 0, blockLength);
            if (n >= 0) {
                DEBUG_DO(++countSame);
                index[i] = n;
            } else {
                n = getOverlap(newData, newDataLength, block, 0, blockLength);
                DEBUG_DO(sumOverlaps += n);
#ifdef UCPTRIE_DEBUG
                if (printData) {
                    printBlock(block, blockLength, 0, i << UCPTRIE_SHIFT_3, n, initialValue);
                }
#endif
                index[i] = newDataLength - n;
                while (n < blockLength) {
                    newData[newDataLength++] = block[n++];
                }
            }
        } else /* SAME_AS */ {
            uint32_t j = index[i];
            index[i] = index[j];
        }
    }

#ifdef UCPTRIE_DEBUG
    /* we saved some space */
    printf("compacting UCPTrie: count of 32-bit data words %lu->%lu  countSame=%ld  sumOverlaps=%ld\n",
            (long)dataLength, (long)newDataLength, (long)countSame, (long)sumOverlaps);
#endif
    return newDataLength;
}